

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O1

Aig_Man_t *
Saig_ManCbaUnrollWithCex
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A,
          Vec_Vec_t **pvReg2Frame)

{
  int Level;
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Vec_t *p;
  void **ppvVar10;
  undefined8 *puVar11;
  void *__ptr;
  Aig_Man_t *p_00;
  size_t sVar12;
  char *pcVar13;
  Aig_Obj_t *pAVar14;
  ulong uVar15;
  Aig_Obj_t *p1;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int Entry;
  ulong uVar20;
  
  if (pAig->nTruePis != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x198,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  iVar7 = pCex->iPo;
  if (((long)iVar7 < 0) || (pAig->nTruePos <= iVar7)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x19a,
                  "Aig_Man_t *Saig_ManCbaUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **, Vec_Vec_t **)"
                 );
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(4000);
  pVVar8->pArray = piVar9;
  *pvMapPiF2A = pVVar8;
  Level = pCex->iFrame;
  uVar16 = Level + 1;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar6 = 8;
  if (6 < (ulong)(long)Level) {
    uVar6 = uVar16;
  }
  p->nSize = 0;
  p->nCap = uVar6;
  if (uVar6 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)(int)uVar6 * 8);
  }
  p->pArray = ppvVar10;
  uVar20 = (ulong)uVar16;
  if (-1 < Level) {
    uVar18 = 0;
    do {
      puVar11 = (undefined8 *)malloc(0x10);
      *puVar11 = 0;
      puVar11[1] = 0;
      ppvVar10[uVar18] = puVar11;
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  p->nSize = uVar16;
  if (uVar6 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)(int)uVar6 << 3);
  }
  if (-1 < Level) {
    uVar18 = 0;
    do {
      puVar11 = (undefined8 *)malloc(0x10);
      *puVar11 = 0;
      puVar11[1] = 0;
      *(undefined8 **)((long)__ptr + uVar18 * 8) = puVar11;
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  if (iVar7 < pAig->vCos->nSize) {
    Vec_VecPushInt(p,Level,*(int *)((long)pAig->vCos->pArray[iVar7] + 0x24));
    lVar19 = (long)pCex->iFrame;
    if (-1 < (long)pCex->iFrame) {
      do {
        Aig_ManIncrementTravId(pAig);
        if (p->nSize <= lVar19) goto LAB_006074b0;
        ppvVar10 = p->pArray;
        pvVar2 = ppvVar10[lVar19];
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar17 = 0;
          do {
            pVVar3 = pAig->vObjs;
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              pAVar14 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar6 = *(uint *)(*(long *)((long)pvVar2 + 8) + lVar17 * 4);
              if (((int)uVar6 < 0) || (pVVar3->nSize <= (int)uVar6)) goto LAB_00607491;
              pAVar14 = (Aig_Obj_t *)pVVar3->pArray[uVar6];
            }
            if (Level < lVar19) goto LAB_006074b0;
            if (lVar19 == 0) {
              pVVar8 = (Vec_Int_t *)0x0;
            }
            else {
              pVVar8 = (Vec_Int_t *)ppvVar10[lVar19 + -1];
            }
            Saig_ManCbaUnrollCollect_rec
                      (pAig,pAVar14,*(Vec_Int_t **)((long)__ptr + lVar19 * 8),pVVar8);
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(int *)((long)pvVar2 + 4));
        }
        bVar5 = 0 < lVar19;
        lVar19 = lVar19 + -1;
      } while (bVar5);
    }
    p_00 = Aig_ManStart(10000);
    pcVar4 = pAig->pName;
    if (pcVar4 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      sVar12 = strlen(pcVar4);
      pcVar13 = (char *)malloc(sVar12 + 1);
      strcpy(pcVar13,pcVar4);
    }
    p_00->pName = pcVar13;
    pcVar4 = pAig->pSpec;
    if (pcVar4 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      sVar12 = strlen(pcVar4);
      pcVar13 = (char *)malloc(sVar12 + 1);
      strcpy(pcVar13,pcVar4);
    }
    p_00->pSpec = pcVar13;
    iVar7 = pAig->nRegs;
    if (iVar7 == pCex->nRegs) {
      if (0 < iVar7) {
        uVar6 = 0;
        do {
          uVar16 = pAig->nTruePis + uVar6;
          if (((int)uVar16 < 0) || (pAig->vCis->nSize <= (int)uVar16)) goto LAB_00607491;
          *(ulong *)((long)pAig->vCis->pArray[uVar16] + 0x28) =
               (ulong)(((uint)(&pCex[1].iPo)[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) == 0) ^
               (ulong)p_00->pConst1;
          uVar6 = uVar6 + 1;
        } while ((int)uVar6 < pAig->nRegs);
      }
    }
    else if (0 < iVar7) {
      iVar7 = 0;
      do {
        uVar6 = pAig->nTruePis + iVar7;
        if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_00607491;
        *(ulong *)((long)pAig->vCis->pArray[uVar6] + 0x28) = (ulong)p_00->pConst1 ^ 1;
        iVar7 = iVar7 + 1;
      } while (iVar7 < pAig->nRegs);
    }
    if (-1 < pCex->iFrame) {
      iVar7 = -1;
      if (-1 < Level) {
        iVar7 = Level;
      }
      uVar18 = 0;
      do {
        if (uVar18 == iVar7 + 1) {
LAB_006074b0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        lVar19 = *(long *)((long)__ptr + uVar18 * 8);
        Entry = (int)uVar18;
        if (0 < *(int *)(lVar19 + 4)) {
          lVar17 = 0;
          do {
            pVVar3 = pAig->vObjs;
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              piVar9 = (int *)0x0;
            }
            else {
              uVar6 = *(uint *)(*(long *)(lVar19 + 8) + lVar17 * 4);
              if (((int)uVar6 < 0) || (pVVar3->nSize <= (int)uVar6)) goto LAB_00607491;
              piVar9 = (int *)pVVar3->pArray[uVar6];
            }
            uVar6 = ((uint)*(undefined8 *)(piVar9 + 6) & 7) - 7;
            if (uVar6 < 0xfffffffe) {
              uVar16 = (uint)*(undefined8 *)(piVar9 + 6) & 7;
              if (uVar16 == 3) {
                if (((ulong)piVar9 & 1) != 0) goto LAB_006074ee;
                uVar15 = *(ulong *)(piVar9 + 2) & 0xfffffffffffffffe;
                if (uVar15 == 0) {
                  pAVar14 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar14 = (Aig_Obj_t *)
                            ((ulong)((uint)*(ulong *)(piVar9 + 2) & 1) ^ *(ulong *)(uVar15 + 0x28));
                }
                goto LAB_006071b3;
              }
              if (((ulong)piVar9 & 1) != 0) {
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
              }
              if (uVar16 == 2) {
                if (*piVar9 < pAig->nTruePis) {
                  if (0xfffffffd < uVar6) {
LAB_0060754b:
                    __assert_fail("!Aig_ObjIsNode(pObj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                  ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
                  }
                  if (*piVar9 < nInputs) {
                    uVar6 = *piVar9 + pCex->nRegs + pCex->nPis * Entry;
                    *(ulong *)(piVar9 + 10) =
                         (ulong)(((uint)(&pCex[1].iPo)[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) == 0)
                         ^ (ulong)p_00->pConst1;
                  }
                  else {
                    pAVar14 = Aig_ObjCreateCi(p_00);
                    *(Aig_Obj_t **)(piVar9 + 10) = pAVar14;
                    if (0xfffffffd < (piVar9[6] & 7U) - 7) goto LAB_0060754b;
                    Vec_IntPush(*pvMapPiF2A,*piVar9);
                    Vec_IntPush(*pvMapPiF2A,Entry);
                  }
                }
              }
              else if (uVar16 == 1) {
                pAVar14 = p_00->pConst1;
                goto LAB_006071b3;
              }
            }
            else {
              if (((ulong)piVar9 & 1) != 0) {
LAB_006074ee:
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
              }
              uVar15 = *(ulong *)(piVar9 + 2) & 0xfffffffffffffffe;
              if (uVar15 == 0) {
                pAVar14 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar14 = (Aig_Obj_t *)
                          ((ulong)((uint)*(ulong *)(piVar9 + 2) & 1) ^ *(ulong *)(uVar15 + 0x28));
              }
              uVar15 = *(ulong *)(piVar9 + 4) & 0xfffffffffffffffe;
              if (uVar15 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              else {
                p1 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(piVar9 + 4) & 1) ^ *(ulong *)(uVar15 + 0x28));
              }
              pAVar14 = Aig_And(p_00,pAVar14,p1);
LAB_006071b3:
              *(Aig_Obj_t **)(piVar9 + 10) = pAVar14;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(int *)(lVar19 + 4));
        }
        if (uVar18 == (uint)pCex->iFrame) break;
        if ((long)p->nSize <= (long)uVar18) goto LAB_006074b0;
        pvVar2 = p->pArray[uVar18];
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar19 = 0;
          do {
            pVVar3 = pAig->vObjs;
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              piVar9 = (int *)0x0;
            }
            else {
              uVar6 = *(uint *)(*(long *)((long)pvVar2 + 8) + lVar19 * 4);
              if (((int)uVar6 < 0) || (pVVar3->nSize <= (int)uVar6)) goto LAB_00607491;
              piVar9 = (int *)pVVar3->pArray[uVar6];
            }
            if (((piVar9[6] & 7U) != 3) || (*piVar9 < pAig->nTruePos)) {
              __assert_fail("Saig_ObjIsLi(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                            ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar6 = (*piVar9 - pAig->nTruePos) + pAig->nTruePis;
            if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_00607491;
            *(undefined8 *)((long)pAig->vCis->pArray[uVar6] + 0x28) = *(undefined8 *)(piVar9 + 10);
            if (*pvReg2Frame != (Vec_Vec_t *)0x0) {
              Vec_VecPushInt(*pvReg2Frame,Entry,piVar9[9]);
              iVar1 = *(int *)((*(ulong *)(piVar9 + 10) & 0xfffffffffffffffe) + 0x24);
              if (iVar1 < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              Vec_VecPushInt(*pvReg2Frame,Entry,((uint)*(ulong *)(piVar9 + 10) & 1) + iVar1 * 2);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < *(int *)((long)pvVar2 + 4));
        }
        bVar5 = (long)uVar18 < (long)pCex->iFrame;
        uVar18 = uVar18 + 1;
      } while (bVar5);
    }
    iVar7 = pCex->iPo;
    if ((-1 < (long)iVar7) && (iVar7 < pAig->vCos->nSize)) {
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(*(ulong *)((long)pAig->vCos->pArray[iVar7] + 0x28) ^ 1));
      Aig_ManSetRegNum(p_00,0);
      iVar7 = p->nSize;
      if (0 < (long)iVar7) {
        ppvVar10 = p->pArray;
        lVar19 = 0;
        do {
          pvVar2 = ppvVar10[lVar19];
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
              *(undefined8 *)((long)pvVar2 + 8) = 0;
            }
            free(pvVar2);
          }
          lVar19 = lVar19 + 1;
        } while (iVar7 != lVar19);
      }
      if (p->pArray != (void **)0x0) {
        free(p->pArray);
        p->pArray = (void **)0x0;
      }
      free(p);
      if (-1 < Level) {
        uVar18 = 0;
        do {
          pvVar2 = *(void **)((long)__ptr + uVar18 * 8);
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
              *(undefined8 *)((long)pvVar2 + 8) = 0;
            }
            free(pvVar2);
          }
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      Aig_ManCleanup(p_00);
      return p_00;
    }
  }
LAB_00607491:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManCbaUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A, Vec_Vec_t ** pvReg2Frame )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
//    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCbaUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    if ( Saig_ManRegNum(pAig) == pCex->nRegs )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    }
    else // this is the case when synthesis was applied, assume all-0 init state
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), 1 );
    }
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
        {
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
            if ( *pvReg2Frame )
            {
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjId(pObj) );             // record LO
                Vec_VecPushInt( *pvReg2Frame, f, Aig_ObjToLit((Aig_Obj_t *)pObj->pData) ); // record its literal
            }
        }
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}